

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O1

bool __thiscall cmFileTimes::Load(cmFileTimes *this,string *fileName)

{
  _Head_base<0UL,_cmFileTimes::Times_*,_false> _Var1;
  int iVar2;
  _Head_base<0UL,_cmFileTimes::Times_*,_false> _Var3;
  stat st;
  stat local_b0;
  
  _Var3._M_head_impl =
       (this->times)._M_t.
       super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
       super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
       super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (Times *)0x0) {
    _Var3._M_head_impl = (Times *)operator_new(0x10);
    ((_Var3._M_head_impl)->timeBuf).actime = 0;
    ((_Var3._M_head_impl)->timeBuf).modtime = 0;
  }
  else {
    (this->times)._M_t.
    super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
    super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
    super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl = (Times *)0x0;
  }
  iVar2 = stat((fileName->_M_dataplus)._M_p,&local_b0);
  if (-1 < iVar2) {
    ((_Var3._M_head_impl)->timeBuf).actime = local_b0.st_atim.tv_sec;
    ((_Var3._M_head_impl)->timeBuf).modtime = local_b0.st_mtim.tv_sec;
    _Var1._M_head_impl =
         (this->times)._M_t.
         super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
         super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
         super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl;
    (this->times)._M_t.
    super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
    super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
    super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var1._M_head_impl != (Times *)0x0) {
      operator_delete(_Var1._M_head_impl,0x10);
    }
    _Var3._M_head_impl = (Times *)0x0;
  }
  if (_Var3._M_head_impl != (Times *)0x0) {
    operator_delete(_Var3._M_head_impl,0x10);
  }
  return -1 < iVar2;
}

Assistant:

bool cmFileTimes::Load(std::string const& fileName)
{
  std::unique_ptr<Times> ptr;
  if (this->IsValid()) {
    // Invalidate this and re-use times
    ptr.swap(this->times);
  } else {
    ptr = cm::make_unique<Times>();
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  cmFileTimes::WindowsHandle handle =
    CreateFileW(cmSystemTools::ConvertToWindowsExtendedPath(fileName).c_str(),
                GENERIC_READ, FILE_SHARE_READ, 0, OPEN_EXISTING,
                FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!handle) {
    return false;
  }
  if (!GetFileTime(handle, &ptr->timeCreation, &ptr->timeLastAccess,
                   &ptr->timeLastWrite)) {
    return false;
  }
#else
  struct stat st;
  if (stat(fileName.c_str(), &st) < 0) {
    return false;
  }
  ptr->timeBuf.actime = st.st_atime;
  ptr->timeBuf.modtime = st.st_mtime;
#endif
  // Accept times
  this->times = std::move(ptr);
  return true;
}